

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::DvpValidateCommittedShaderResources
          (DeviceContextVkImpl *this,ResourceBindInfo *BindInfo)

{
  array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *paVar1;
  PipelineResourceSignatureImplType *pPVar2;
  VkDescriptorSetLayout_T *pVVar3;
  VkDescriptorSetLayout_T *pVVar4;
  uint Index;
  undefined4 in_stack_ffffffffffffff68;
  uint uVar5;
  uint local_90;
  uint local_8c;
  ResourceBindInfo *local_88;
  array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL> *local_80;
  string msg;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((BindInfo->super_CommittedShaderResources).ResourcesValidated == false) {
    local_48 = 0;
    uStack_40 = 0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifySRBCompatibility
              ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,
               &BindInfo->super_CommittedShaderResources,
               (function<Diligent::PipelineResourceSignatureVkImpl_*(unsigned_int)> *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    local_8c = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignatureCount
                         (&((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.
                           m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    local_80 = &BindInfo->SetInfo;
    local_88 = BindInfo;
    for (Index = 0; Index < local_8c; Index = Index + 1) {
      pPVar2 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                         (&((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.
                           m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>,Index);
      if (pPVar2 != (PipelineResourceSignatureImplType *)0x0) {
        pVVar3 = (pPVar2->m_VkDescrSetLayouts)._M_elems[0].m_VkObject;
        pVVar4 = (pPVar2->m_VkDescrSetLayouts)._M_elems[1].m_VkObject;
        if (pVVar3 != (VkDescriptorSetLayout_T *)0x0 || pVVar4 != (VkDescriptorSetLayout_T *)0x0) {
          uVar5 = Index;
          if (((BindInfo->super_CommittedShaderResources).StaleSRBMask &
              (BindInfo->super_CommittedShaderResources).ActiveSRBMask) != 0) {
            FormatString<char[57]>
                      (&msg,(char (*) [57])
                            "CommitDescriptorSets() must be called before validation.");
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"DvpValidateCommittedShaderResources",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,499);
            std::__cxx11::string::~string((string *)&msg);
            pVVar3 = (pPVar2->m_VkDescrSetLayouts)._M_elems[0].m_VkObject;
            pVVar4 = (pPVar2->m_VkDescrSetLayouts)._M_elems[1].m_VkObject;
            uVar5 = Index;
          }
          paVar1 = local_80;
          Index = uVar5;
          for (local_90 = 0; BindInfo = local_88,
              local_90 <
              ((pVVar4 != (VkDescriptorSetLayout_T *)0x0) + 1) -
              (uint)(pVVar3 == (VkDescriptorSetLayout_T *)0x0); local_90 = local_90 + 1) {
            if (paVar1->_M_elems[uVar5].vkSets._M_elems[local_90] == (VkDescriptorSet_T *)0x0) {
              FormatString<char[27],unsigned_int,char[39],char_const*,char[18],unsigned_int,char[2]>
                        (&msg,(Diligent *)"descriptor set with index ",(char (*) [27])&local_90,
                         (uint *)" is not bound for resource signature \'",
                         (char (*) [39])
                         &(pPVar2->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                          ).
                          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          .m_Desc,(char **)"\', binding index ",
                         (char (*) [18])&stack0xffffffffffffff6c,(uint *)0x665ed2,
                         (char (*) [2])CONCAT44(Index,in_stack_ffffffffffffff68));
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"DvpValidateCommittedShaderResources",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                         ,0x1fb);
              std::__cxx11::string::~string((string *)&msg);
            }
          }
          if (paVar1->_M_elems[uVar5].LastBoundBaseInd != paVar1->_M_elems[uVar5].BaseInd) {
            FormatString<char[34],unsigned_int,char[33],unsigned_int,char[56],unsigned_int,char[77]>
                      (&msg,(Diligent *)"Shader resource binding at index ",
                       (char (*) [34])&stack0xffffffffffffff6c,
                       (uint *)" has descriptor set base offset ",
                       (char (*) [33])&paVar1->_M_elems[uVar5].BaseInd,
                       (uint *)", but currently bound descriptor sets have base offset ",
                       (char (*) [56])&paVar1->_M_elems[uVar5].LastBoundBaseInd,
                       (uint *)
                       "; one of the resource signatures with lower binding index is not compatible."
                       ,(char (*) [77])CONCAT44(Index,in_stack_ffffffffffffff68));
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"DvpValidateCommittedShaderResources",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x201);
            std::__cxx11::string::~string((string *)&msg);
          }
        }
      }
    }
    PipelineStateVkImpl::DvpVerifySRBResources
              ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.m_pObject,this
               ,(ShaderResourceCacheArrayType *)BindInfo);
    (BindInfo->super_CommittedShaderResources).ResourcesValidated = true;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::DvpValidateCommittedShaderResources(ResourceBindInfo& BindInfo)
{
    if (BindInfo.ResourcesValidated)
        return;

    DvpVerifySRBCompatibility(BindInfo);

    const Uint32 SignCount = m_pPipelineState->GetResourceSignatureCount();
    for (Uint32 i = 0; i < SignCount; ++i)
    {
        const PipelineResourceSignatureVkImpl* pSign = m_pPipelineState->GetResourceSignature(i);
        if (pSign == nullptr || pSign->GetNumDescriptorSets() == 0)
            continue; // Skip null and empty signatures

        DEV_CHECK_ERR((BindInfo.StaleSRBMask & BindInfo.ActiveSRBMask) == 0, "CommitDescriptorSets() must be called before validation.");

        const ResourceBindInfo::DescriptorSetInfo& SetInfo = BindInfo.SetInfo[i];
        const Uint32                               DSCount = pSign->GetNumDescriptorSets();
        for (Uint32 s = 0; s < DSCount; ++s)
        {
            DEV_CHECK_ERR(SetInfo.vkSets[s] != VK_NULL_HANDLE,
                          "descriptor set with index ", s, " is not bound for resource signature '",
                          pSign->GetDesc().Name, "', binding index ", i, ".");
        }

        DEV_CHECK_ERR(SetInfo.LastBoundBaseInd == SetInfo.BaseInd,
                      "Shader resource binding at index ", i, " has descriptor set base offset ", SetInfo.BaseInd,
                      ", but currently bound descriptor sets have base offset ", SetInfo.LastBoundBaseInd,
                      "; one of the resource signatures with lower binding index is not compatible.");
    }

    m_pPipelineState->DvpVerifySRBResources(this, BindInfo.ResourceCaches);

    BindInfo.ResourcesValidated = true;
}